

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::EntryShift(RecyclableObject *function,CallInfo callInfo,...)

{
  uint32 index;
  uint64 *puVar1;
  Type *pTVar2;
  Type TVar3;
  ScriptContext *scriptContext;
  SparseArraySegmentBase *pSVar4;
  Recycler *recycler;
  InterruptPoller *pIVar5;
  code *pcVar6;
  bool bVar7;
  char cVar8;
  bool bVar9;
  DynamicObjectFlags DVar10;
  int iVar11;
  BOOL BVar12;
  uint32 uVar13;
  uint uVar14;
  undefined4 *puVar15;
  Var pvVar16;
  JavascriptArray *pJVar17;
  uint64 uVar18;
  uint64 uVar19;
  RecyclableObject *extraout_RAX;
  RecyclableObject *pRVar20;
  uint32 index_00;
  Var pvVar21;
  double dVar22;
  undefined1 *value;
  undefined1 auVar23 [16];
  int in_stack_00000010;
  BigIndex local_c0;
  undefined1 local_b0 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  undefined1 local_80 [8];
  BigIndex length;
  JsReentLock jsReentLock;
  Var res;
  RecyclableObject *dynamicObject;
  ScriptContext *local_38;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1765,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar7) goto LAB_00b88768;
    *puVar15 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_b0 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_b0,(CallInfo *)&args.super_Arguments.Values);
  local_38 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
  length.bigIndex = (uint64)local_38->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)length.bigIndex)->noJsReentrancy;
  ((ThreadContext *)length.bigIndex)->noJsReentrancy = true;
  pvVar16 = Arguments::operator[]((Arguments *)local_b0,0);
  JsReentLock::setObjectForMutation((JsReentLock *)&length.bigIndex,pvVar16);
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x176a,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar7) goto LAB_00b88768;
    *puVar15 = 0;
  }
  jsReentLock._24_8_ =
       (((local_38->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
       undefinedValue.ptr;
  pRVar20 = (RecyclableObject *)jsReentLock._24_8_;
  if (((ulong)local_b0 & 0xffffff) == 0) goto LAB_00b88580;
  pvVar16 = Arguments::operator[]((Arguments *)local_b0,0);
  bVar7 = IsNonES5Array(pvVar16);
  if (bVar7) {
    pvVar16 = Arguments::operator[]((Arguments *)local_b0,0);
    pJVar17 = VarTo<Js::JavascriptArray>(pvVar16);
    iVar11 = (*(pJVar17->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
               super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
               [0x66])(pJVar17);
    if (iVar11 != 0) goto LAB_00b87f29;
    pvVar16 = Arguments::operator[]((Arguments *)local_b0,0);
    pJVar17 = UnsafeVarTo<Js::JavascriptArray>(pvVar16);
    bVar7 = HasAnyES5ArrayInPrototypeChain(pJVar17,false);
    if (bVar7) goto LAB_00b87f29;
    pvVar16 = Arguments::operator[]((Arguments *)local_b0,0);
    pJVar17 = UnsafeVarTo<Js::JavascriptArray>(pvVar16);
    TVar3 = (pJVar17->super_ArrayObject).length;
    pRVar20 = (RecyclableObject *)jsReentLock._24_8_;
    if (TVar3 != 0) {
      bVar7 = IsFillFromPrototypes(pJVar17);
      if (bVar7) {
        FillFromPrototypes(pJVar17,0,(pJVar17->super_ArrayObject).length);
      }
      if (TVar3 != (pJVar17->super_ArrayObject).length) {
        Throw::FatalInternalError(-0x7fffbffb);
      }
      DVar10 = DynamicObject::GetArrayFlags((DynamicObject *)pJVar17);
      if ((((DVar10 & HasNoMissingValues) != None) &&
          (pSVar4 = (pJVar17->head).ptr, pSVar4 != (SparseArraySegmentBase *)0x0)) &&
         ((pSVar4->next).ptr != (SparseArraySegmentBase *)0x0)) {
        DVar10 = DynamicObject::GetArrayFlags((DynamicObject *)pJVar17);
        DynamicObject::SetArrayFlags((DynamicObject *)pJVar17,DVar10 & ~HasNoMissingValues);
      }
      pTVar2 = &(pJVar17->super_ArrayObject).length;
      *pTVar2 = *pTVar2 - 1;
      ClearSegmentMap(pJVar17);
      recycler = local_38->recycler;
      bVar7 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>(pJVar17);
      if (bVar7) {
        bVar9 = false;
      }
      else {
        bVar9 = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(pJVar17);
      }
      local_80 = (undefined1  [8])local_38->threadContext;
      length.index._0_2_ = 0;
      length.index._2_1_ = 1;
      pIVar5 = ((ThreadContext *)local_80)->interruptPoller;
      if (pIVar5 != (InterruptPoller *)0x0) {
        length.index._0_2_ = (ushort)pIVar5->isDisabled << 8;
        pIVar5->isDisabled = true;
      }
      pSVar4 = (pJVar17->head).ptr;
      if (pSVar4->length != 0) {
        if (bVar7) {
          uVar14 = SparseArraySegment<int>::GetElement((SparseArraySegment<int> *)pSVar4,0);
          if (uVar14 == 0xfff80002) {
            jsReentLock._24_8_ =
                 (((local_38->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
          }
          else {
            jsReentLock._24_8_ = (ulong)uVar14 | 0x1000000000000;
          }
          SparseArraySegment<int>::RemoveElement
                    ((SparseArraySegment<int> *)(pJVar17->head).ptr,recycler,0);
        }
        else if (bVar9 == false) {
          jsReentLock._24_8_ =
               SparseArraySegment<void_*>::GetElement((SparseArraySegment<void_*> *)pSVar4,0);
          if ((undefined1 *)jsReentLock._24_8_ == &DAT_40002fff80002) {
            jsReentLock._24_8_ =
                 (((local_38->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
          }
          else {
            jsReentLock._24_8_ = CrossSite::MarshalVar(local_38,(Var)jsReentLock._24_8_,false);
          }
          SparseArraySegment<void_*>::RemoveElement
                    ((SparseArraySegment<void_*> *)(pJVar17->head).ptr,recycler,0);
        }
        else {
          value = (undefined1 *)
                  SparseArraySegment<double>::GetElement((SparseArraySegment<double> *)pSVar4,0);
          if (value == &DAT_fff80002fff80002) {
            jsReentLock._24_8_ =
                 (((local_38->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
          }
          else {
            jsReentLock._24_8_ = JavascriptNumber::ToVarNoCheck((double)value,local_38);
          }
          SparseArraySegment<double>::RemoveElement
                    ((SparseArraySegment<double> *)(pJVar17->head).ptr,recycler,0);
        }
      }
      if (bVar7) {
        ShiftHelper<int>(pJVar17,local_38);
      }
      else if (bVar9 == false) {
        ShiftHelper<void*>(pJVar17,local_38);
      }
      else {
        ShiftHelper<double>(pJVar17,local_38);
      }
      length.index._0_1_ = 1;
      AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)local_80);
      pRVar20 = extraout_RAX;
    }
    if (TVar3 == 0) goto LAB_00b88580;
  }
  else {
LAB_00b87f29:
    res = (Var)0x0;
    pvVar16 = Arguments::operator[]((Arguments *)local_b0,0);
    BVar12 = JavascriptConversion::ToObject(pvVar16,local_38,(RecyclableObject **)&res);
    if (BVar12 == 0) {
      JavascriptError::ThrowTypeError(local_38,-0x7ff5ec42,L"Array.prototype.shift");
    }
    *(undefined1 *)(length.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    uVar18 = OP_GetLength(res,local_38);
    BigIndex::BigIndex((BigIndex *)local_80,uVar18);
    JsReentLock::MutateArrayObject((JsReentLock *)&length.bigIndex);
    *(undefined1 *)(length.bigIndex + 0x108) = 1;
    BigIndex::BigIndex(&local_c0,0);
    cVar8 = BigIndex::operator==((BigIndex *)local_80,&local_c0);
    *(undefined1 *)(length.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    if ((bool)cVar8) {
      BVar12 = JavascriptOperators::SetProperty
                         (res,(RecyclableObject *)res,0xd1,&DAT_1000000000000,local_38,
                          PropertyOperation_ThrowIfNotExtensible);
      if (BVar12 == 0) {
        JavascriptError::ThrowTypeError(local_38,-0x7ff5fe43,L"Array.prototype.shift");
      }
      JsReentLock::MutateArrayObject((JsReentLock *)&length.bigIndex);
      *(undefined1 *)(length.bigIndex + 0x108) = 1;
      pRVar20 = (((local_38->super_ScriptContextBase).javascriptLibrary)->
                super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    else {
      BVar12 = JavascriptOperators::GetItem
                         ((RecyclableObject *)res,0,(Var *)&jsReentLock.m_savedNoJsReentrancy,
                          local_38);
      JsReentLock::MutateArrayObject((JsReentLock *)&length.bigIndex);
      *(undefined1 *)(length.bigIndex + 0x108) = 1;
      if (BVar12 == 0) {
        jsReentLock._24_8_ =
             (((local_38->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
      }
      BigIndex::operator--((BigIndex *)local_80);
      dynamicObject._7_1_ = cVar8;
      if (local_80._0_4_ == 0xffffffff) {
        uVar13 = 0xffffffff;
      }
      else {
        uVar13 = BigIndex::GetSmallIndex((BigIndex *)local_80);
      }
      if (uVar13 != 0) {
        puVar1 = &length.bigIndex;
        index_00 = 0;
        do {
          *(undefined1 *)(length.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          index = index_00 + 1;
          BVar12 = JavascriptOperators::HasItem((RecyclableObject *)res,index);
          JsReentLock::MutateArrayObject((JsReentLock *)puVar1);
          *(undefined1 *)(length.bigIndex + 0x108) = 1;
          *(undefined1 *)(length.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          if (BVar12 == 0) {
            BVar12 = JavascriptOperators::DeleteItem
                               ((RecyclableObject *)res,index_00,
                                PropertyOperation_ThrowOnDeleteIfNotConfig);
            if (BVar12 == 0) {
              JavascriptError::ThrowTypeError(local_38,-0x7ff5fe43,L"Array.prototype.shift");
            }
            JsReentLock::MutateArrayObject((JsReentLock *)puVar1);
          }
          else {
            pvVar16 = JavascriptOperators::GetItem((RecyclableObject *)res,index,local_38);
            BVar12 = JavascriptOperators::SetItem
                               (res,(RecyclableObject *)res,index_00,pvVar16,local_38,
                                PropertyOperation_ThrowIfNotExtensible,1);
            if (BVar12 == 0) {
              JavascriptError::ThrowTypeError(local_38,-0x7ff5fe43,L"Array.prototype.shift");
            }
            JsReentLock::MutateArrayObject((JsReentLock *)puVar1);
          }
          *(undefined1 *)(length.bigIndex + 0x108) = 1;
          index_00 = index;
        } while (uVar13 != index);
      }
      puVar1 = &length.bigIndex;
      uVar18 = 0xffffffff;
      while( true ) {
        BigIndex::BigIndex(&local_c0,uVar18);
        bVar7 = BigIndex::operator>((BigIndex *)local_80,&local_c0);
        pvVar16 = res;
        if (!bVar7) break;
        *(undefined1 *)(length.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        uVar19 = uVar18 + 1;
        BVar12 = JavascriptOperators::HasItem((RecyclableObject *)res,uVar19);
        JsReentLock::MutateArrayObject((JsReentLock *)puVar1);
        *(undefined1 *)(length.bigIndex + 0x108) = 1;
        *(undefined1 *)(length.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        if (BVar12 == 0) {
          BVar12 = JavascriptOperators::DeleteItem
                             ((RecyclableObject *)res,uVar18,
                              PropertyOperation_ThrowOnDeleteIfNotConfig);
          if (BVar12 == 0) {
            JavascriptError::ThrowTypeError(local_38,-0x7ff5fe43,L"Array.prototype.shift");
          }
          JsReentLock::MutateArrayObject((JsReentLock *)puVar1);
        }
        else {
          pvVar16 = JavascriptOperators::GetItem((RecyclableObject *)res,uVar19,local_38);
          BVar12 = JavascriptOperators::SetItem
                             (res,(RecyclableObject *)res,uVar18,pvVar16,local_38,
                              PropertyOperation_ThrowIfNotExtensible);
          if (BVar12 == 0) {
            JavascriptError::ThrowTypeError(local_38,-0x7ff5fe43,L"Array.prototype.shift");
          }
          JsReentLock::MutateArrayObject((JsReentLock *)puVar1);
        }
        *(undefined1 *)(length.bigIndex + 0x108) = 1;
        uVar18 = uVar19;
      }
      *(undefined1 *)(length.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      if (local_80._0_4_ == 0xffffffff) {
        uVar18 = BigIndex::GetBigIndex((BigIndex *)local_80);
        cVar8 = dynamicObject._7_1_;
        BVar12 = JavascriptOperators::DeleteItem
                           ((RecyclableObject *)pvVar16,uVar18,
                            PropertyOperation_ThrowOnDeleteIfNotConfig);
        pvVar16 = res;
        if (BVar12 == 0) goto LAB_00b8877f;
        uVar18 = BigIndex::GetBigIndex((BigIndex *)local_80);
        if (uVar18 < 0x80000000) {
          pvVar21 = (Var)(uVar18 | 0x1000000000000);
        }
        else {
          auVar23._8_4_ = (int)(uVar18 >> 0x20);
          auVar23._0_8_ = uVar18;
          auVar23._12_4_ = 0x45300000;
          dVar22 = ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0) +
                   (auVar23._8_8_ - 1.9342813113834067e+25);
          uVar18 = NumberUtilities::ToSpecial(dVar22);
          bVar7 = NumberUtilities::IsNan(dVar22);
          if (((bVar7) &&
              (uVar19 = NumberUtilities::ToSpecial(dVar22), uVar19 != 0xfff8000000000000)) &&
             (uVar19 = NumberUtilities::ToSpecial(dVar22), uVar19 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar15 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar7) goto LAB_00b88768;
            *puVar15 = 0;
          }
          pvVar21 = (Var)(uVar18 ^ 0xfffc000000000000);
        }
        BVar12 = JavascriptOperators::SetProperty
                           (pvVar16,(RecyclableObject *)pvVar16,0xd1,pvVar21,local_38,
                            PropertyOperation_ThrowIfNotExtensible);
        if (BVar12 == 0) goto LAB_00b8877f;
        JsReentLock::MutateArrayObject((JsReentLock *)&length.bigIndex);
      }
      else {
        uVar13 = BigIndex::GetSmallIndex((BigIndex *)local_80);
        cVar8 = dynamicObject._7_1_;
        BVar12 = JavascriptOperators::DeleteItem
                           ((RecyclableObject *)pvVar16,uVar13,
                            PropertyOperation_ThrowOnDeleteIfNotConfig);
        pvVar16 = res;
        if (BVar12 == 0) {
LAB_00b8877f:
          JavascriptError::ThrowTypeError(local_38,-0x7ff5fe43,L"Array.prototype.shift");
        }
        uVar13 = BigIndex::GetSmallIndex((BigIndex *)local_80);
        if ((int)uVar13 < 0) {
          dVar22 = (double)uVar13;
          uVar18 = NumberUtilities::ToSpecial(dVar22);
          bVar7 = NumberUtilities::IsNan(dVar22);
          if (((bVar7) &&
              (uVar19 = NumberUtilities::ToSpecial(dVar22), uVar19 != 0xfff8000000000000)) &&
             (uVar19 = NumberUtilities::ToSpecial(dVar22), uVar19 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar15 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar7) {
LAB_00b88768:
              pcVar6 = (code *)invalidInstructionException();
              (*pcVar6)();
            }
            *puVar15 = 0;
          }
          pvVar21 = (Var)(uVar18 ^ 0xfffc000000000000);
        }
        else {
          pvVar21 = (Var)((ulong)uVar13 | 0x1000000000000);
        }
        BVar12 = JavascriptOperators::SetProperty
                           (pvVar16,(RecyclableObject *)pvVar16,0xd1,pvVar21,local_38,
                            PropertyOperation_ThrowIfNotExtensible);
        if (BVar12 == 0) goto LAB_00b8877f;
        JsReentLock::MutateArrayObject((JsReentLock *)&length.bigIndex);
      }
      *(undefined1 *)(length.bigIndex + 0x108) = 1;
      pRVar20 = (RecyclableObject *)length.bigIndex;
    }
    if (cVar8 != '\0') goto LAB_00b88580;
  }
  pRVar20 = (RecyclableObject *)jsReentLock._24_8_;
LAB_00b88580:
  *(undefined1 *)(length.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pRVar20;
}

Assistant:

Var JavascriptArray::EntryShift(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_Shift);
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, args[0]);

        Assert(!(callInfo.Flags & CallFlags_New));

        Var res = scriptContext->GetLibrary()->GetUndefined();

        if (args.Info.Count == 0)
        {
            return res;
        }

        bool useNoSideEffectShift = JavascriptArray::IsNonES5Array(args[0])
            && !VarTo<JavascriptArray>(args[0])->IsCrossSiteObject()
            && !HasAnyES5ArrayInPrototypeChain(UnsafeVarTo<JavascriptArray>(args[0]));

        if (useNoSideEffectShift)
        {
            JavascriptArray * pArr = UnsafeVarTo<JavascriptArray>(args[0]);

            if (pArr->length == 0)
            {
                return res;
            }

            uint32 length = pArr->length;

            if(pArr->IsFillFromPrototypes())
            {
                pArr->FillFromPrototypes(0, pArr->length); // We need find all missing value from [[proto]] object
            }

            // As we have already established that the FillFromPrototype should not change the bound of the array.
            if (length != pArr->length)
            {
                Js::Throw::FatalInternalError();
            }

            if(pArr->HasNoMissingValues() && pArr->head && pArr->head->next)
            {
                // This function currently does not track missing values in the head segment if there are multiple segments
                pArr->SetHasNoMissingValues(false);
            }

            pArr->length--;

            pArr->ClearSegmentMap(); // Dump segmentMap on shift (before any allocation)

            Recycler * recycler = scriptContext->GetRecycler();

            bool isIntArray = false;
            bool isFloatArray = false;

            if(VarIs<JavascriptNativeIntArray>(pArr))
            {
                isIntArray = true;
            }
            else if(VarIs<JavascriptNativeFloatArray>(pArr))
            {
                isFloatArray = true;
            }

            // Code below has potential to throw due to OOM or SO. Just FailFast on those cases
            AutoDisableInterrupt failFastOnError(scriptContext->GetThreadContext());

            if (pArr->head->length != 0)
            {
                if(isIntArray)
                {
                    int32 nativeResult = SparseArraySegment<int32>::From(pArr->head)->GetElement(0);

                    if(SparseArraySegment<int32>::IsMissingItem(&nativeResult))
                    {
                        res = scriptContext->GetLibrary()->GetUndefined();
                    }
                    else
                    {
                        res = Js::JavascriptNumber::ToVar(nativeResult, scriptContext);
                    }
                    SparseArraySegment<int32>::From(pArr->head)->RemoveElement(recycler, 0);
                }
                else if (isFloatArray)
                {
                    double nativeResult = SparseArraySegment<double>::From(pArr->head)->GetElement(0);

                    if(SparseArraySegment<double>::IsMissingItem(&nativeResult))
                    {
                        res = scriptContext->GetLibrary()->GetUndefined();
                    }
                    else
                    {
                        res = Js::JavascriptNumber::ToVarNoCheck(nativeResult, scriptContext);
                    }
                    SparseArraySegment<double>::From(pArr->head)->RemoveElement(recycler, 0);
                }
                else
                {
                    res = SparseArraySegment<Var>::From(pArr->head)->GetElement(0);

                    if(SparseArraySegment<Var>::IsMissingItem(&res))
                    {
                        res = scriptContext->GetLibrary()->GetUndefined();
                    }
                    else
                    {
                        res = CrossSite::MarshalVar(scriptContext, res);
                    }
                    SparseArraySegment<Var>::From(pArr->head)->RemoveElement(recycler, 0);
                }
            }

            if(isIntArray)
            {
                ShiftHelper<int32>(pArr, scriptContext);
            }
            else if (isFloatArray)
            {
                ShiftHelper<double>(pArr, scriptContext);
            }
            else
            {
                ShiftHelper<Var>(pArr, scriptContext);
            }
            failFastOnError.Completed();

        }
        else
        {
            RecyclableObject* dynamicObject = nullptr;
            if (FALSE == JavascriptConversion::ToObject(args[0], scriptContext, &dynamicObject))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.shift"));
            }

            ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.shift"));

            JS_REENTRANT(jsReentLock, BigIndex length = OP_GetLength(dynamicObject, scriptContext));

            if (length == 0u)
            {
                // If length is 0, return 'undefined'
                JS_REENTRANT(jsReentLock,
                    h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(dynamicObject, dynamicObject, PropertyIds::length, TaggedInt::ToVarUnchecked(0), scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                return scriptContext->GetLibrary()->GetUndefined();
            }

            JS_REENTRANT(jsReentLock,
                BOOL gotItem = JavascriptOperators::GetItem(dynamicObject, 0u, &res, scriptContext));
            if (!gotItem)
            {
                res = scriptContext->GetLibrary()->GetUndefined();
            }
            --length;
            uint32 lengthToUin32Max = length.IsSmallIndex() ? length.GetSmallIndex() : MaxArrayLength;
            for (uint32 i = 0u; i < lengthToUin32Max; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(dynamicObject, i + 1));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock,
                        element = JavascriptOperators::GetItem(dynamicObject, i + 1, scriptContext),
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(dynamicObject, dynamicObject, i, element, scriptContext, PropertyOperation_ThrowIfNotExtensible, /*skipPrototypeCheck*/ true)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(dynamicObject, i, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }
            }

            for (uint64 i = MaxArrayLength; length > i; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(dynamicObject, i + 1));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock,
                        element = JavascriptOperators::GetItem(dynamicObject, i + 1, scriptContext),
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(dynamicObject, dynamicObject, i, element, scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(dynamicObject, i, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }
            }

            if (length.IsSmallIndex())
            {
                JS_REENTRANT(jsReentLock,
                    h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(dynamicObject, length.GetSmallIndex(), PropertyOperation_ThrowOnDeleteIfNotConfig)),
                    h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(dynamicObject, dynamicObject, PropertyIds::length, JavascriptNumber::ToVar(length.GetSmallIndex(), scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)));
            }
            else
            {
                JS_REENTRANT(jsReentLock,
                    h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(dynamicObject, length.GetBigIndex(), PropertyOperation_ThrowOnDeleteIfNotConfig)),
                    h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(dynamicObject, dynamicObject, PropertyIds::length, JavascriptNumber::ToVar(length.GetBigIndex(), scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)));
            }
        }
        return res;
        JIT_HELPER_END(Array_Shift);
    }